

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::js::GeneratorOptions::ParseFromOptions
          (GeneratorOptions *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,string *error)

{
  int iVar1;
  LogMessage *other;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  pointer ppVar9;
  GeneratorOptions *pGVar10;
  long lVar11;
  bool bVar12;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  GeneratorOptions *local_a0;
  GeneratorOptions *local_98;
  GeneratorOptions *local_90;
  undefined1 local_88 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar9 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar12 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish != ppVar9;
  if (bVar12) {
    local_a0 = (GeneratorOptions *)&this->extension;
    local_98 = (GeneratorOptions *)&this->library;
    local_90 = (GeneratorOptions *)&this->namespace_prefix;
    lVar11 = 0;
    uVar7 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
        if (iVar1 != 0) {
          pcVar8 = (char *)error->_M_string_length;
          pcVar6 = "Unexpected option value for add_require_for_enums";
LAB_0025e583:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar8,(ulong)pcVar6);
LAB_0025e58a:
          if (bVar12) {
            return false;
          }
          break;
        }
        this->add_require_for_enums = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
        ppVar9 = (options->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
          if (iVar1 != 0) {
            pcVar8 = (char *)error->_M_string_length;
            pcVar6 = "Unexpected option value for binary";
            goto LAB_0025e583;
          }
          this->binary = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
          ppVar9 = (options->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
            if (iVar1 != 0) {
              pcVar8 = (char *)error->_M_string_length;
              pcVar6 = "Unexpected option value for testonly";
              goto LAB_0025e583;
            }
            this->testonly = true;
          }
          else {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
            if (iVar1 == 0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_88,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0xd8d);
              other = internal::LogMessage::operator<<
                                ((LogMessage *)local_88,
                                 "Ignoring error_on_name_conflict option, this will be removed in a future release"
                                );
              internal::LogFinisher::operator=((LogFinisher *)&local_c0,other);
              internal::LogMessage::~LogMessage((LogMessage *)local_88);
            }
            else {
              iVar1 = std::__cxx11::string::compare
                                ((char *)((long)&(((options->
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                 )._M_dataplus._M_p + lVar11));
              pGVar10 = this;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)((long)&(((options->
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                pGVar10 = local_90;
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare
                                    ((char *)((long)&(((options->
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                  pGVar10 = local_98;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)((long)&(((options->
                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                    ppVar9 = (options->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (iVar1 == 0) {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11)
                                        );
                      if (iVar1 == 0) {
                        this->import_style = kImportClosure;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(((options->
                                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                        if (iVar1 == 0) {
                          this->import_style = kImportCommonJs;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(((options->
                                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                          if (iVar1 == 0) {
                            this->import_style = kImportCommonJsStrict;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare
                                              ((char *)((long)&(((options->
                                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                            if (iVar1 == 0) {
                              this->import_style = kImportBrowser;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare
                                                ((char *)((long)&(((options->
                                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                              if (iVar1 == 0) {
                                this->import_style = kImportEs6;
                              }
                              else {
                                std::operator+(&local_50,"Unknown import style ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&(((options->
                                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
                                local_c0 = &local_b0;
                                plVar4 = plVar2 + 2;
                                if ((long *)*plVar2 == plVar4) {
                                  local_b0 = *plVar4;
                                  lStack_a8 = plVar2[3];
                                }
                                else {
                                  local_b0 = *plVar4;
                                  local_c0 = (long *)*plVar2;
                                }
                                local_b8 = plVar2[1];
                                *plVar2 = (long)plVar4;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
                                psVar5 = (size_type *)(plVar2 + 2);
                                if ((size_type *)*plVar2 == psVar5) {
                                  local_88._16_8_ = *psVar5;
                                  local_88._24_8_ = plVar2[3];
                                  local_88._0_8_ = local_88 + 0x10;
                                }
                                else {
                                  local_88._16_8_ = *psVar5;
                                  local_88._0_8_ = (size_type *)*plVar2;
                                }
                                local_88._8_8_ = plVar2[1];
                                *plVar2 = (long)psVar5;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                std::__cxx11::string::operator=((string *)error,(string *)local_88);
                                if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                                  operator_delete((void *)local_88._0_8_);
                                }
                                if (local_c0 != &local_b0) {
                                  operator_delete(local_c0);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                  operator_delete(local_50._M_dataplus._M_p);
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0025e3f5;
                    }
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
                    pGVar10 = local_a0;
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(((options->
                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                      ppVar9 = (options->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if (iVar1 == 0) {
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for one_output_file_per_input_file";
LAB_0025e653:
                          std::__cxx11::string::operator=((string *)error,pcVar8);
                          goto LAB_0025e58a;
                        }
                        this->one_output_file_per_input_file = true;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11
                                                   ));
                        ppVar9 = (options->
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p +
                                                     lVar11));
                          pGVar10 = this;
                          if (iVar1 != 0) {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_88,"Unknown option: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&(((options->
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                            std::__cxx11::string::operator=((string *)error,(string *)local_88);
                            if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                              operator_delete((void *)local_88._0_8_);
                            }
                            goto LAB_0025e58a;
                          }
                          goto LAB_0025e3f0;
                        }
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for annotate_code";
                          goto LAB_0025e653;
                        }
                        this->annotate_code = true;
                      }
                      goto LAB_0025e3f5;
                    }
                  }
                }
              }
LAB_0025e3f0:
              std::__cxx11::string::_M_assign((string *)pGVar10);
            }
          }
        }
      }
LAB_0025e3f5:
      uVar7 = uVar7 + 1;
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(options->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 6;
      lVar11 = lVar11 + 0x40;
      bVar12 = uVar7 < uVar3;
    } while (uVar7 < uVar3);
  }
  bVar12 = true;
  if ((this->import_style != kImportClosure) &&
     ((((this->add_require_for_enums != false || (this->testonly != false)) ||
       ((this->library)._M_string_length != 0)) ||
      ((iVar1 = std::__cxx11::string::compare((char *)&this->extension), iVar1 != 0 ||
       (this->one_output_file_per_input_file == true)))))) {
    bVar12 = false;
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x3edc13);
  }
  return bVar12;
}

Assistant:

bool GeneratorOptions::ParseFromOptions(
    const std::vector<std::pair<std::string, std::string> >& options,
    std::string* error) {
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "add_require_for_enums") {
      if (options[i].second != "") {
        *error = "Unexpected option value for add_require_for_enums";
        return false;
      }
      add_require_for_enums = true;
    } else if (options[i].first == "binary") {
      if (options[i].second != "") {
        *error = "Unexpected option value for binary";
        return false;
      }
      binary = true;
    } else if (options[i].first == "testonly") {
      if (options[i].second != "") {
        *error = "Unexpected option value for testonly";
        return false;
      }
      testonly = true;

    } else if (options[i].first == "error_on_name_conflict") {
      GOOGLE_LOG(WARNING) << "Ignoring error_on_name_conflict option, this "
                             "will be removed in a future release";
    } else if (options[i].first == "output_dir") {
      output_dir = options[i].second;
    } else if (options[i].first == "namespace_prefix") {
      namespace_prefix = options[i].second;
    } else if (options[i].first == "library") {
      library = options[i].second;
    } else if (options[i].first == "import_style") {
      if (options[i].second == "closure") {
        import_style = kImportClosure;
      } else if (options[i].second == "commonjs") {
        import_style = kImportCommonJs;
      } else if (options[i].second == "commonjs_strict") {
        import_style = kImportCommonJsStrict;
      } else if (options[i].second == "browser") {
        import_style = kImportBrowser;
      } else if (options[i].second == "es6") {
        import_style = kImportEs6;
      } else {
        *error = "Unknown import style " + options[i].second + ", expected " +
                 "one of: closure, commonjs, browser, es6.";
      }
    } else if (options[i].first == "extension") {
      extension = options[i].second;
    } else if (options[i].first == "one_output_file_per_input_file") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for one_output_file_per_input_file";
        return false;
      }
      one_output_file_per_input_file = true;
    } else if (options[i].first == "annotate_code") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for annotate_code";
        return false;
      }
      annotate_code = true;
    } else {
      // Assume any other option is an output directory, as long as it is a bare
      // `key` rather than a `key=value` option.
      if (options[i].second != "") {
        *error = "Unknown option: " + options[i].first;
        return false;
      }
      output_dir = options[i].first;
    }
  }

  if (import_style != kImportClosure &&
      (add_require_for_enums || testonly || !library.empty() ||
       extension != ".js" || one_output_file_per_input_file)) {
    *error =
        "The add_require_for_enums, testonly, library, extension, and "
        "one_output_file_per_input_file options should only be "
        "used for import_style=closure";
    return false;
  }

  return true;
}